

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O2

void __thiscall Privkey_Privkey_Test::TestBody(Privkey_Privkey_Test *this)

{
  char *message;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_70;
  AssertionResult gtest_ar;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48 [4];
  Privkey privkey;
  
  cfd::core::Privkey::Privkey(&privkey);
  cfd::core::Privkey::GetData();
  cfd::core::ByteData::GetHex_abi_cxx11_();
  message = "";
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"privkey.GetData().GetHex().c_str()","\"\"",
             (char *)local_48[0].ptr_,"");
  std::__cxx11::string::~string((string *)local_48);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_70);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_48);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_privkey.cpp"
               ,0x16,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_70,(Message *)local_48);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr(local_48);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&privkey);
  return;
}

Assistant:

TEST(Privkey, Privkey) {
  Privkey privkey;
  EXPECT_STREQ(privkey.GetData().GetHex().c_str(), "");
}